

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  bool bVar2;
  _List_iterator<cmExpandedCommandArgument> __x;
  _List_iterator<cmExpandedCommandArgument> _Var3;
  _List_iterator<cmExpandedCommandArgument> __last;
  bool value;
  int iVar4;
  _List_iterator<cmExpandedCommandArgument> __x_00;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> subExpr;
  string local_78;
  cmExpandedCommandArgument local_58;
  
  __x_00._M_node = (_List_node_base *)newArgs;
  do {
    do {
      __x_00._M_node = (__x_00._M_node)->_M_next;
      if (__x_00._M_node == (_List_node_base *)newArgs) {
LAB_003cf1b4:
        return __x_00._M_node == (_List_node_base *)newArgs;
      }
      keyword.super_string_view._M_str = DAT_007b9730;
      keyword.super_string_view._M_len = (anonymous_namespace)::keyParenL;
      bVar1 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(__x_00._M_node + 1));
    } while (!bVar1);
    __x = std::next<std::_List_iterator<cmExpandedCommandArgument>>(__x_00,1);
    for (iVar4 = 1; (__x._M_node != (_List_node_base *)newArgs && (iVar4 != 0));
        iVar4 = (iVar4 + (uint)bVar1) - (uint)bVar2) {
      keyword_00.super_string_view._M_str = DAT_007b9730;
      keyword_00.super_string_view._M_len = (anonymous_namespace)::keyParenL;
      bVar1 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(__x._M_node + 1));
      keyword_01.super_string_view._M_str = DAT_007b9740;
      keyword_01.super_string_view._M_len = (anonymous_namespace)::keyParenR;
      bVar2 = IsKeyword(this,keyword_01,(cmExpandedCommandArgument *)(__x._M_node + 1));
      __x._M_node = (__x._M_node)->_M_next;
    }
    if (iVar4 != 0) {
      std::__cxx11::string::assign((char *)errorString);
      *status = FATAL_ERROR;
      goto LAB_003cf1b4;
    }
    _Var3 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(__x_00,1);
    __last = std::prev<std::_List_iterator<cmExpandedCommandArgument>>(__x,1);
    std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
    vector<std::_List_iterator<cmExpandedCommandArgument>,void>
              ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
               &subExpr,_Var3,__last,(allocator_type *)&local_58);
    bVar1 = IsTrue(this,&subExpr,errorString,status);
    (anonymous_namespace)::bool2string_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)(ulong)bVar1,value);
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&local_78,true);
    cmExpandedCommandArgument::operator=
              ((cmExpandedCommandArgument *)(__x_00._M_node + 1),&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    _Var3 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(__x_00,1);
    std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
              (&newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
               (const_iterator)_Var3._M_node,(const_iterator)__x._M_node);
    std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
              (&subExpr);
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto arg = newArgs.begin(); arg != newArgs.end(); ++arg) {
    if (this->IsKeyword(keyParenL, *arg)) {
      // search for the closing paren for this opening one
      auto depth = 1;
      auto argClose = std::next(arg);
      for (; argClose != newArgs.end() && depth; ++argClose) {
        depth += int(this->IsKeyword(keyParenL, *argClose)) -
          int(this->IsKeyword(keyParenR, *argClose));
      }
      if (depth) {
        errorString = "mismatched parenthesis in condition";
        status = MessageType::FATAL_ERROR;
        return false;
      }

      // store the reduced args in this vector
      auto argOpen = std::next(arg);
      const std::vector<cmExpandedCommandArgument> subExpr(
        argOpen, std::prev(argClose));

      // now recursively invoke IsTrue to handle the values inside the
      // parenthetical expression
      const auto value = this->IsTrue(subExpr, errorString, status);
      *arg = cmExpandedCommandArgument(bool2string(value), true);
      argOpen = std::next(arg);
      // remove the now evaluated parenthetical expression
      newArgs.erase(argOpen, argClose);
    }
  }
  return true;
}